

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Validator::validate
          (Validator *this,Reader *type,Reader *value,uint *dataSizeInBits,bool *isPointer)

{
  Which WVar1;
  Which WVar2;
  uint local_48;
  uint local_44;
  Fault local_40;
  Fault f;
  bool hadCase;
  Which expectedValueType;
  bool *isPointer_local;
  uint *dataSizeInBits_local;
  Reader *value_local;
  Reader *type_local;
  Validator *this_local;
  
  validate(this,type);
  f.exception._6_2_ = VOID;
  f.exception._5_1_ = 0;
  WVar1 = capnp::schema::Type::Reader::which(type);
  switch(WVar1) {
  case VOID:
    f.exception._6_2_ = VOID;
    *dataSizeInBits = 0;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case BOOL:
    f.exception._6_2_ = BOOL;
    *dataSizeInBits = 1;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case INT8:
    f.exception._6_2_ = INT8;
    *dataSizeInBits = 8;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case INT16:
    f.exception._6_2_ = INT16;
    *dataSizeInBits = 0x10;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case INT32:
    f.exception._6_2_ = INT32;
    *dataSizeInBits = 0x20;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case INT64:
    f.exception._6_2_ = INT64;
    *dataSizeInBits = 0x40;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case UINT8:
    f.exception._6_2_ = UINT8;
    *dataSizeInBits = 8;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case UINT16:
    f.exception._6_2_ = UINT16;
    *dataSizeInBits = 0x10;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case UINT32:
    f.exception._6_2_ = UINT32;
    *dataSizeInBits = 0x20;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case UINT64:
    f.exception._6_2_ = UINT64;
    *dataSizeInBits = 0x40;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case FLOAT32:
    f.exception._6_2_ = FLOAT32;
    *dataSizeInBits = 0x20;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case FLOAT64:
    f.exception._6_2_ = FLOAT64;
    *dataSizeInBits = 0x40;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case TEXT:
    f.exception._6_2_ = TEXT;
    *dataSizeInBits = 0;
    *isPointer = true;
    f.exception._5_1_ = 1;
    break;
  case DATA:
    f.exception._6_2_ = DATA;
    *dataSizeInBits = 0;
    *isPointer = true;
    f.exception._5_1_ = 1;
    break;
  case LIST:
    f.exception._6_2_ = LIST;
    *dataSizeInBits = 0;
    *isPointer = true;
    f.exception._5_1_ = 1;
    break;
  case ENUM:
    f.exception._6_2_ = ENUM;
    *dataSizeInBits = 0x10;
    *isPointer = false;
    f.exception._5_1_ = 1;
    break;
  case STRUCT:
    f.exception._6_2_ = STRUCT;
    *dataSizeInBits = 0;
    *isPointer = true;
    f.exception._5_1_ = 1;
    break;
  case INTERFACE:
    f.exception._6_2_ = INTERFACE;
    *dataSizeInBits = 0;
    *isPointer = true;
    f.exception._5_1_ = 1;
    break;
  case ANY_POINTER:
    f.exception._6_2_ = ANY_POINTER;
    *dataSizeInBits = 0;
    *isPointer = true;
    f.exception._5_1_ = 1;
  }
  if (((f.exception._5_1_ & 1) != 0) &&
     (WVar2 = capnp::schema::Value::Reader::which(value), WVar2 != f.exception._6_2_)) {
    WVar2 = capnp::schema::Value::Reader::which(value);
    local_44 = (uint)WVar2;
    local_48 = (uint)f.exception._6_2_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],unsigned_int,unsigned_int>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x1f1,FAILED,"value.which() == expectedValueType",
               "\"Value did not match type.\", (uint)value.which(), (uint)expectedValueType",
               (char (*) [26])"Value did not match type.",&local_44,&local_48);
    this->isValid = false;
    kj::_::Debug::Fault::~Fault(&local_40);
  }
  return;
}

Assistant:

void validate(const schema::Type::Reader& type, const schema::Value::Reader& value,
                uint* dataSizeInBits, bool* isPointer) {
    validate(type);

    schema::Value::Which expectedValueType = schema::Value::VOID;
    bool hadCase = false;
    switch (type.which()) {
#define HANDLE_TYPE(name, bits, ptr) \
      case schema::Type::name: \
        expectedValueType = schema::Value::name; \
        *dataSizeInBits = bits; *isPointer = ptr; \
        hadCase = true; \
        break;
      HANDLE_TYPE(VOID, 0, false)
      HANDLE_TYPE(BOOL, 1, false)
      HANDLE_TYPE(INT8, 8, false)
      HANDLE_TYPE(INT16, 16, false)
      HANDLE_TYPE(INT32, 32, false)
      HANDLE_TYPE(INT64, 64, false)
      HANDLE_TYPE(UINT8, 8, false)
      HANDLE_TYPE(UINT16, 16, false)
      HANDLE_TYPE(UINT32, 32, false)
      HANDLE_TYPE(UINT64, 64, false)
      HANDLE_TYPE(FLOAT32, 32, false)
      HANDLE_TYPE(FLOAT64, 64, false)
      HANDLE_TYPE(TEXT, 0, true)
      HANDLE_TYPE(DATA, 0, true)
      HANDLE_TYPE(LIST, 0, true)
      HANDLE_TYPE(ENUM, 16, false)
      HANDLE_TYPE(STRUCT, 0, true)
      HANDLE_TYPE(INTERFACE, 0, true)
      HANDLE_TYPE(ANY_POINTER, 0, true)
#undef HANDLE_TYPE
    }

    if (hadCase) {
      VALIDATE_SCHEMA(value.which() == expectedValueType, "Value did not match type.",
                      (uint)value.which(), (uint)expectedValueType);
    }
  }